

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O0

void __thiscall QEvdevTouchScreenHandler::unregisterPointingDevice(QEvdevTouchScreenHandler *this)

{
  undefined8 uVar1;
  QCoreApplication *pQVar2;
  undefined8 uVar3;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x28) != 0) {
    pQVar2 = QCoreApplication::instance();
    if (pQVar2 == (QCoreApplication *)0x0) {
      if (*(long **)(in_RDI + 0x28) != (long *)0x0) {
        (**(code **)(**(long **)(in_RDI + 0x28) + 0x20))();
      }
    }
    else {
      uVar1 = *(undefined8 *)(in_RDI + 0x28);
      QCoreApplication::instance();
      uVar3 = QObject::thread();
      QObject::moveToThread(uVar1,uVar3);
      QObject::deleteLater();
    }
    *(undefined8 *)(in_RDI + 0x28) = 0;
  }
  return;
}

Assistant:

void QEvdevTouchScreenHandler::unregisterPointingDevice()
{
    if (!m_device)
        return;

    if (QGuiApplication::instance()) {
        m_device->moveToThread(QGuiApplication::instance()->thread());
        m_device->deleteLater();
    } else {
        delete m_device;
    }
    m_device = nullptr;
}